

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factory.cpp
# Opt level: O0

ColumnRef clickhouse::anon_unknown_34::CreateTerminalColumn(TypeAst *ast)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args_1;
  size_type sVar2;
  const_reference pvVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_07;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_08;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_09;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_12;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_13;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_14;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_15;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_16;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_17;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_18;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_19;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_20;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_21;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_22;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_23;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_24;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_25;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  long in_RSI;
  element_type *in_RDI;
  ColumnRef CVar5;
  shared_ptr<clickhouse::ColumnDate> *in_stack_fffffffffffffe18;
  vector<clickhouse::TypeAst,_std::allocator<clickhouse::TypeAst>_> *in_stack_fffffffffffffe20;
  int64_t *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe48;
  
  __args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (ulong)*(uint *)(in_RSI + 4);
  switch(__args_1) {
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0:
    std::make_shared<clickhouse::ColumnNothing>();
    std::shared_ptr<clickhouse::Column>::shared_ptr<clickhouse::ColumnNothing,void>
              ((shared_ptr<clickhouse::Column> *)in_stack_fffffffffffffe20,
               (shared_ptr<clickhouse::ColumnNothing> *)in_stack_fffffffffffffe18);
    std::shared_ptr<clickhouse::ColumnNothing>::~shared_ptr
              ((shared_ptr<clickhouse::ColumnNothing> *)0x201a3f);
    _Var4._M_pi = extraout_RDX;
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1:
    std::make_shared<clickhouse::ColumnVector<signed_char>>();
    std::shared_ptr<clickhouse::Column>::shared_ptr<clickhouse::ColumnVector<signed_char>,void>
              ((shared_ptr<clickhouse::Column> *)in_stack_fffffffffffffe20,
               (shared_ptr<clickhouse::ColumnVector<signed_char>_> *)in_stack_fffffffffffffe18);
    std::shared_ptr<clickhouse::ColumnVector<signed_char>_>::~shared_ptr
              ((shared_ptr<clickhouse::ColumnVector<signed_char>_> *)0x201b34);
    _Var4._M_pi = extraout_RDX_04;
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2:
    std::make_shared<clickhouse::ColumnVector<short>>();
    std::shared_ptr<clickhouse::Column>::shared_ptr<clickhouse::ColumnVector<short>,void>
              ((shared_ptr<clickhouse::Column> *)in_stack_fffffffffffffe20,
               (shared_ptr<clickhouse::ColumnVector<short>_> *)in_stack_fffffffffffffe18);
    std::shared_ptr<clickhouse::ColumnVector<short>_>::~shared_ptr
              ((shared_ptr<clickhouse::ColumnVector<short>_> *)0x201b65);
    _Var4._M_pi = extraout_RDX_05;
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3:
    std::make_shared<clickhouse::ColumnVector<int>>();
    std::shared_ptr<clickhouse::Column>::shared_ptr<clickhouse::ColumnVector<int>,void>
              ((shared_ptr<clickhouse::Column> *)in_stack_fffffffffffffe20,
               (shared_ptr<clickhouse::ColumnVector<int>_> *)in_stack_fffffffffffffe18);
    std::shared_ptr<clickhouse::ColumnVector<int>_>::~shared_ptr
              ((shared_ptr<clickhouse::ColumnVector<int>_> *)0x201b96);
    _Var4._M_pi = extraout_RDX_06;
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4:
    std::make_shared<clickhouse::ColumnVector<long>>();
    std::shared_ptr<clickhouse::Column>::shared_ptr<clickhouse::ColumnVector<long>,void>
              ((shared_ptr<clickhouse::Column> *)in_stack_fffffffffffffe20,
               (shared_ptr<clickhouse::ColumnVector<long>_> *)in_stack_fffffffffffffe18);
    std::shared_ptr<clickhouse::ColumnVector<long>_>::~shared_ptr
              ((shared_ptr<clickhouse::ColumnVector<long>_> *)0x201bc7);
    _Var4._M_pi = extraout_RDX_07;
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5:
    std::make_shared<clickhouse::ColumnVector<unsigned_char>>();
    std::shared_ptr<clickhouse::Column>::shared_ptr<clickhouse::ColumnVector<unsigned_char>,void>
              ((shared_ptr<clickhouse::Column> *)in_stack_fffffffffffffe20,
               (shared_ptr<clickhouse::ColumnVector<unsigned_char>_> *)in_stack_fffffffffffffe18);
    std::shared_ptr<clickhouse::ColumnVector<unsigned_char>_>::~shared_ptr
              ((shared_ptr<clickhouse::ColumnVector<unsigned_char>_> *)0x201a70);
    _Var4._M_pi = extraout_RDX_00;
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x6:
    std::make_shared<clickhouse::ColumnVector<unsigned_short>>();
    std::shared_ptr<clickhouse::Column>::shared_ptr<clickhouse::ColumnVector<unsigned_short>,void>
              ((shared_ptr<clickhouse::Column> *)in_stack_fffffffffffffe20,
               (shared_ptr<clickhouse::ColumnVector<unsigned_short>_> *)in_stack_fffffffffffffe18);
    std::shared_ptr<clickhouse::ColumnVector<unsigned_short>_>::~shared_ptr
              ((shared_ptr<clickhouse::ColumnVector<unsigned_short>_> *)0x201aa1);
    _Var4._M_pi = extraout_RDX_01;
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x7:
    std::make_shared<clickhouse::ColumnVector<unsigned_int>>();
    std::shared_ptr<clickhouse::Column>::shared_ptr<clickhouse::ColumnVector<unsigned_int>,void>
              ((shared_ptr<clickhouse::Column> *)in_stack_fffffffffffffe20,
               (shared_ptr<clickhouse::ColumnVector<unsigned_int>_> *)in_stack_fffffffffffffe18);
    std::shared_ptr<clickhouse::ColumnVector<unsigned_int>_>::~shared_ptr
              ((shared_ptr<clickhouse::ColumnVector<unsigned_int>_> *)0x201ad2);
    _Var4._M_pi = extraout_RDX_02;
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x8:
    std::make_shared<clickhouse::ColumnVector<unsigned_long>>();
    std::shared_ptr<clickhouse::Column>::shared_ptr<clickhouse::ColumnVector<unsigned_long>,void>
              ((shared_ptr<clickhouse::Column> *)in_stack_fffffffffffffe20,
               (shared_ptr<clickhouse::ColumnVector<unsigned_long>_> *)in_stack_fffffffffffffe18);
    std::shared_ptr<clickhouse::ColumnVector<unsigned_long>_>::~shared_ptr
              ((shared_ptr<clickhouse::ColumnVector<unsigned_long>_> *)0x201b03);
    _Var4._M_pi = extraout_RDX_03;
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x9:
    std::make_shared<clickhouse::ColumnVector<float>>();
    std::shared_ptr<clickhouse::Column>::shared_ptr<clickhouse::ColumnVector<float>,void>
              ((shared_ptr<clickhouse::Column> *)in_stack_fffffffffffffe20,
               (shared_ptr<clickhouse::ColumnVector<float>_> *)in_stack_fffffffffffffe18);
    std::shared_ptr<clickhouse::ColumnVector<float>_>::~shared_ptr
              ((shared_ptr<clickhouse::ColumnVector<float>_> *)0x201bf8);
    _Var4._M_pi = extraout_RDX_08;
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xa:
    std::make_shared<clickhouse::ColumnVector<double>>();
    std::shared_ptr<clickhouse::Column>::shared_ptr<clickhouse::ColumnVector<double>,void>
              ((shared_ptr<clickhouse::Column> *)in_stack_fffffffffffffe20,
               (shared_ptr<clickhouse::ColumnVector<double>_> *)in_stack_fffffffffffffe18);
    std::shared_ptr<clickhouse::ColumnVector<double>_>::~shared_ptr
              ((shared_ptr<clickhouse::ColumnVector<double>_> *)0x201c29);
    _Var4._M_pi = extraout_RDX_09;
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xb:
    std::make_shared<clickhouse::ColumnString>();
    std::shared_ptr<clickhouse::Column>::shared_ptr<clickhouse::ColumnString,void>
              ((shared_ptr<clickhouse::Column> *)in_stack_fffffffffffffe20,
               (shared_ptr<clickhouse::ColumnString> *)in_stack_fffffffffffffe18);
    std::shared_ptr<clickhouse::ColumnString>::~shared_ptr
              ((shared_ptr<clickhouse::ColumnString> *)0x201dd6);
    _Var4._M_pi = extraout_RDX_14;
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xc:
    std::vector<clickhouse::TypeAst,_std::allocator<clickhouse::TypeAst>_>::front
              (in_stack_fffffffffffffe20);
    std::make_shared<clickhouse::ColumnFixedString,long_const&>((long *)in_stack_fffffffffffffe48);
    std::shared_ptr<clickhouse::Column>::shared_ptr<clickhouse::ColumnFixedString,void>
              ((shared_ptr<clickhouse::Column> *)in_stack_fffffffffffffe20,
               (shared_ptr<clickhouse::ColumnFixedString> *)in_stack_fffffffffffffe18);
    std::shared_ptr<clickhouse::ColumnFixedString>::~shared_ptr
              ((shared_ptr<clickhouse::ColumnFixedString> *)0x201e1f);
    _Var4._M_pi = extraout_RDX_15;
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xd:
    bVar1 = std::vector<clickhouse::TypeAst,_std::allocator<clickhouse::TypeAst>_>::empty
                      ((vector<clickhouse::TypeAst,_std::allocator<clickhouse::TypeAst>_> *)in_RDI);
    if (bVar1) {
      std::make_shared<clickhouse::ColumnDateTime>();
      std::shared_ptr<clickhouse::Column>::shared_ptr<clickhouse::ColumnDateTime,void>
                ((shared_ptr<clickhouse::Column> *)in_stack_fffffffffffffe20,
                 (shared_ptr<clickhouse::ColumnDateTime> *)in_stack_fffffffffffffe18);
      std::shared_ptr<clickhouse::ColumnDateTime>::~shared_ptr
                ((shared_ptr<clickhouse::ColumnDateTime> *)0x201e67);
      _Var4._M_pi = extraout_RDX_16;
    }
    else {
      std::vector<clickhouse::TypeAst,_std::allocator<clickhouse::TypeAst>_>::operator[]
                ((vector<clickhouse::TypeAst,_std::allocator<clickhouse::TypeAst>_> *)
                 (in_RSI + 0x50),0);
      std::make_shared<clickhouse::ColumnDateTime,std::__cxx11::string_const&>
                (in_stack_fffffffffffffe48);
      std::shared_ptr<clickhouse::Column>::shared_ptr<clickhouse::ColumnDateTime,void>
                ((shared_ptr<clickhouse::Column> *)in_stack_fffffffffffffe20,
                 (shared_ptr<clickhouse::ColumnDateTime> *)in_stack_fffffffffffffe18);
      std::shared_ptr<clickhouse::ColumnDateTime>::~shared_ptr
                ((shared_ptr<clickhouse::ColumnDateTime> *)0x201eb4);
      _Var4._M_pi = extraout_RDX_17;
    }
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xe:
    bVar1 = std::vector<clickhouse::TypeAst,_std::allocator<clickhouse::TypeAst>_>::empty
                      ((vector<clickhouse::TypeAst,_std::allocator<clickhouse::TypeAst>_> *)in_RDI);
    if (bVar1) {
      std::shared_ptr<clickhouse::Column>::shared_ptr
                ((shared_ptr<clickhouse::Column> *)in_stack_fffffffffffffe20,
                 in_stack_fffffffffffffe18);
      _Var4._M_pi = extraout_RDX_18;
    }
    else {
      sVar2 = std::vector<clickhouse::TypeAst,_std::allocator<clickhouse::TypeAst>_>::size
                        ((vector<clickhouse::TypeAst,_std::allocator<clickhouse::TypeAst>_> *)
                         (in_RSI + 0x50));
      if (sVar2 == 1) {
        std::vector<clickhouse::TypeAst,_std::allocator<clickhouse::TypeAst>_>::operator[]
                  ((vector<clickhouse::TypeAst,_std::allocator<clickhouse::TypeAst>_> *)
                   (in_RSI + 0x50),0);
        std::make_shared<clickhouse::ColumnDateTime64,long_const&>
                  ((long *)in_stack_fffffffffffffe48);
        std::shared_ptr<clickhouse::Column>::shared_ptr<clickhouse::ColumnDateTime64,void>
                  ((shared_ptr<clickhouse::Column> *)in_stack_fffffffffffffe20,
                   (shared_ptr<clickhouse::ColumnDateTime64> *)in_stack_fffffffffffffe18);
        std::shared_ptr<clickhouse::ColumnDateTime64>::~shared_ptr
                  ((shared_ptr<clickhouse::ColumnDateTime64> *)0x201f42);
        _Var4._M_pi = extraout_RDX_19;
      }
      else {
        pvVar3 = std::vector<clickhouse::TypeAst,_std::allocator<clickhouse::TypeAst>_>::operator[]
                           ((vector<clickhouse::TypeAst,_std::allocator<clickhouse::TypeAst>_> *)
                            (in_RSI + 0x50),0);
        this = &pvVar3->value;
        std::vector<clickhouse::TypeAst,_std::allocator<clickhouse::TypeAst>_>::operator[]
                  ((vector<clickhouse::TypeAst,_std::allocator<clickhouse::TypeAst>_> *)
                   (in_RSI + 0x50),1);
        std::make_shared<clickhouse::ColumnDateTime64,long_const&,std::__cxx11::string_const&>
                  ((long *)in_stack_fffffffffffffe48,__args_1);
        std::shared_ptr<clickhouse::Column>::shared_ptr<clickhouse::ColumnDateTime64,void>
                  ((shared_ptr<clickhouse::Column> *)this,
                   (shared_ptr<clickhouse::ColumnDateTime64> *)in_stack_fffffffffffffe18);
        std::shared_ptr<clickhouse::ColumnDateTime64>::~shared_ptr
                  ((shared_ptr<clickhouse::ColumnDateTime64> *)0x201faa);
        _Var4._M_pi = extraout_RDX_20;
      }
    }
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xf:
    std::make_shared<clickhouse::ColumnDate>();
    std::shared_ptr<clickhouse::Column>::shared_ptr<clickhouse::ColumnDate,void>
              ((shared_ptr<clickhouse::Column> *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe18
              );
    std::shared_ptr<clickhouse::ColumnDate>::~shared_ptr
              ((shared_ptr<clickhouse::ColumnDate> *)0x201fd2);
    _Var4._M_pi = extraout_RDX_21;
    break;
  default:
    std::shared_ptr<clickhouse::Column>::shared_ptr
              ((shared_ptr<clickhouse::Column> *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe18
              );
    _Var4._M_pi = extraout_RDX_25;
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x15:
    std::make_shared<clickhouse::ColumnUUID>();
    std::shared_ptr<clickhouse::Column>::shared_ptr<clickhouse::ColumnUUID,void>
              ((shared_ptr<clickhouse::Column> *)in_stack_fffffffffffffe20,
               (shared_ptr<clickhouse::ColumnUUID> *)in_stack_fffffffffffffe18);
    std::shared_ptr<clickhouse::ColumnUUID>::~shared_ptr
              ((shared_ptr<clickhouse::ColumnUUID> *)0x202041);
    _Var4._M_pi = extraout_RDX_24;
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x16:
    std::make_shared<clickhouse::ColumnIPv4>();
    std::shared_ptr<clickhouse::Column>::shared_ptr<clickhouse::ColumnIPv4,void>
              ((shared_ptr<clickhouse::Column> *)in_stack_fffffffffffffe20,
               (shared_ptr<clickhouse::ColumnIPv4> *)in_stack_fffffffffffffe18);
    std::shared_ptr<clickhouse::ColumnIPv4>::~shared_ptr
              ((shared_ptr<clickhouse::ColumnIPv4> *)0x201ff7);
    _Var4._M_pi = extraout_RDX_22;
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x17:
    std::make_shared<clickhouse::ColumnIPv6>();
    std::shared_ptr<clickhouse::Column>::shared_ptr<clickhouse::ColumnIPv6,void>
              ((shared_ptr<clickhouse::Column> *)in_stack_fffffffffffffe20,
               (shared_ptr<clickhouse::ColumnIPv6> *)in_stack_fffffffffffffe18);
    std::shared_ptr<clickhouse::ColumnIPv6>::~shared_ptr
              ((shared_ptr<clickhouse::ColumnIPv6> *)0x20201c);
    _Var4._M_pi = extraout_RDX_23;
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x19:
    std::vector<clickhouse::TypeAst,_std::allocator<clickhouse::TypeAst>_>::front
              (in_stack_fffffffffffffe20);
    std::vector<clickhouse::TypeAst,_std::allocator<clickhouse::TypeAst>_>::back
              (in_stack_fffffffffffffe20);
    std::make_shared<clickhouse::ColumnDecimal,long_const&,long_const&>
              ((long *)in_stack_fffffffffffffe48,(long *)__args_1);
    std::shared_ptr<clickhouse::Column>::shared_ptr<clickhouse::ColumnDecimal,void>
              ((shared_ptr<clickhouse::Column> *)in_stack_fffffffffffffe20,
               (shared_ptr<clickhouse::ColumnDecimal> *)in_stack_fffffffffffffe18);
    std::shared_ptr<clickhouse::ColumnDecimal>::~shared_ptr
              ((shared_ptr<clickhouse::ColumnDecimal> *)0x201c91);
    _Var4._M_pi = extraout_RDX_10;
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1a:
    std::vector<clickhouse::TypeAst,_std::allocator<clickhouse::TypeAst>_>::front
              (in_stack_fffffffffffffe20);
    std::make_shared<clickhouse::ColumnDecimal,int,long_const&>
              ((int *)in_stack_fffffffffffffe48,(long *)__args_1);
    std::shared_ptr<clickhouse::Column>::shared_ptr<clickhouse::ColumnDecimal,void>
              ((shared_ptr<clickhouse::Column> *)in_stack_fffffffffffffe20,
               (shared_ptr<clickhouse::ColumnDecimal> *)in_stack_fffffffffffffe18);
    std::shared_ptr<clickhouse::ColumnDecimal>::~shared_ptr
              ((shared_ptr<clickhouse::ColumnDecimal> *)0x201ced);
    _Var4._M_pi = extraout_RDX_11;
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1b:
    std::vector<clickhouse::TypeAst,_std::allocator<clickhouse::TypeAst>_>::front
              (in_stack_fffffffffffffe20);
    std::make_shared<clickhouse::ColumnDecimal,int,long_const&>
              ((int *)in_stack_fffffffffffffe48,(long *)__args_1);
    std::shared_ptr<clickhouse::Column>::shared_ptr<clickhouse::ColumnDecimal,void>
              ((shared_ptr<clickhouse::Column> *)in_stack_fffffffffffffe20,
               (shared_ptr<clickhouse::ColumnDecimal> *)in_stack_fffffffffffffe18);
    std::shared_ptr<clickhouse::ColumnDecimal>::~shared_ptr
              ((shared_ptr<clickhouse::ColumnDecimal> *)0x201d49);
    _Var4._M_pi = extraout_RDX_12;
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1c:
    std::vector<clickhouse::TypeAst,_std::allocator<clickhouse::TypeAst>_>::front
              (in_stack_fffffffffffffe20);
    std::make_shared<clickhouse::ColumnDecimal,int,long_const&>
              ((int *)in_stack_fffffffffffffe48,(long *)__args_1);
    std::shared_ptr<clickhouse::Column>::shared_ptr<clickhouse::ColumnDecimal,void>
              ((shared_ptr<clickhouse::Column> *)in_stack_fffffffffffffe20,
               (shared_ptr<clickhouse::ColumnDecimal> *)in_stack_fffffffffffffe18);
    std::shared_ptr<clickhouse::ColumnDecimal>::~shared_ptr
              ((shared_ptr<clickhouse::ColumnDecimal> *)0x201da5);
    _Var4._M_pi = extraout_RDX_13;
  }
  CVar5.super___shared_ptr<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var4._M_pi;
  CVar5.super___shared_ptr<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (ColumnRef)CVar5.super___shared_ptr<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static ColumnRef CreateTerminalColumn(const TypeAst& ast) {
    switch (ast.code) {
    case Type::Void:
        return std::make_shared<ColumnNothing>();

    case Type::UInt8:
        return std::make_shared<ColumnUInt8>();
    case Type::UInt16:
        return std::make_shared<ColumnUInt16>();
    case Type::UInt32:
        return std::make_shared<ColumnUInt32>();
    case Type::UInt64:
        return std::make_shared<ColumnUInt64>();

    case Type::Int8:
        return std::make_shared<ColumnInt8>();
    case Type::Int16:
        return std::make_shared<ColumnInt16>();
    case Type::Int32:
        return std::make_shared<ColumnInt32>();
    case Type::Int64:
        return std::make_shared<ColumnInt64>();

    case Type::Float32:
        return std::make_shared<ColumnFloat32>();
    case Type::Float64:
        return std::make_shared<ColumnFloat64>();

    case Type::Decimal:
        return std::make_shared<ColumnDecimal>(ast.elements.front().value, ast.elements.back().value);
    case Type::Decimal32:
        return std::make_shared<ColumnDecimal>(9, ast.elements.front().value);
    case Type::Decimal64:
        return std::make_shared<ColumnDecimal>(18, ast.elements.front().value);
    case Type::Decimal128:
        return std::make_shared<ColumnDecimal>(38, ast.elements.front().value);

    case Type::String:
        return std::make_shared<ColumnString>();
    case Type::FixedString:
        return std::make_shared<ColumnFixedString>(ast.elements.front().value);

    case Type::DateTime:
        if (ast.elements.empty()) {
            return std::make_shared<ColumnDateTime>();
        } else {
            return std::make_shared<ColumnDateTime>(ast.elements[0].value_string);
        }
    case Type::DateTime64:
        if (ast.elements.empty()) {
            return nullptr;
        }
        if (ast.elements.size() == 1) {
            return std::make_shared<ColumnDateTime64>(ast.elements[0].value);
        } else {
            return std::make_shared<ColumnDateTime64>(ast.elements[0].value, ast.elements[1].value_string);
        }
    case Type::Date:
        return std::make_shared<ColumnDate>();

    case Type::IPv4:
        return std::make_shared<ColumnIPv4>();
    case Type::IPv6:
        return std::make_shared<ColumnIPv6>();

    case Type::UUID:
        return std::make_shared<ColumnUUID>();

    default:
        return nullptr;
    }
}